

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  bool bVar1;
  cmListFileLexer_Token *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  Delimiter delim;
  long lVar6;
  anon_enum_32 aVar7;
  ostringstream error;
  undefined1 local_1d8 [40];
  long local_1b0;
  undefined1 local_1a8 [24];
  undefined8 uStack_190;
  long local_188;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> avStack_180 [3];
  ios_base local_138 [264];
  
  local_1a8._16_8_ = 0;
  uStack_190 = 0;
  local_1a8._8_8_ = 0;
  local_188 = 0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0 = line;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::operator=((string *)&this->Function,(string *)local_1a8);
  (this->Function).super_cmCommandContext.Line = local_188;
  local_1d8._16_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1d8._0_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1d8._8_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start =
       avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish =
       avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_1d8);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(avStack_180);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar5 = (char *)(this->Function).super_cmCommandContext.Name._M_string_length;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)&this->Function,0,pcVar5,(ulong)name);
  (this->Function).super_cmCommandContext.Line = local_1b0;
  do {
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error in cmake code at\n",0x17);
      pcVar5 = this->FileName;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
      }
      else {
        sVar3 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      cmListFileLexer_GetCurrentLine(this->Lexer);
      poVar4 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"Parse error.  Function missing opening \"(\".",0x2b);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error((char *)local_1d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
      goto LAB_003ba771;
    }
  } while (pcVar2->type == cmListFileLexer_Token_Space);
  if (pcVar2->type == cmListFileLexer_Token_ParenLeft) {
    this->Separation = SeparationOkay;
    cmListFileLexer_GetCurrentLine(this->Lexer);
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 != (cmListFileLexer_Token *)0x0) {
      lVar6 = 0;
      do {
        if (pcVar2->type - cmListFileLexer_Token_Space < 2) {
          this->Separation = SeparationOkay;
          goto LAB_003ba333;
        }
        switch(pcVar2->type) {
        case cmListFileLexer_Token_Identifier:
        case cmListFileLexer_Token_ArgumentUnquoted:
          bVar1 = AddArgument(this,pcVar2,Unquoted);
          aVar7 = SeparationWarning;
          if (!bVar1) {
            return false;
          }
          break;
        case cmListFileLexer_Token_ParenLeft:
          this->Separation = SeparationOkay;
          bVar1 = AddArgument(this,pcVar2,Unquoted);
          if (!bVar1) {
            return false;
          }
          lVar6 = lVar6 + 1;
          goto LAB_003ba333;
        case cmListFileLexer_Token_ParenRight:
          if (lVar6 == 0) {
            return true;
          }
          this->Separation = SeparationOkay;
          bVar1 = AddArgument(this,pcVar2,Unquoted);
          if (!bVar1) {
            return false;
          }
          lVar6 = lVar6 + -1;
          aVar7 = SeparationWarning;
          break;
        case cmListFileLexer_Token_ArgumentQuoted:
          aVar7 = SeparationWarning;
          delim = Quoted;
          goto LAB_003ba411;
        case cmListFileLexer_Token_ArgumentBracket:
          aVar7 = SeparationError;
          delim = Bracket;
LAB_003ba411:
          bVar1 = AddArgument(this,pcVar2,delim);
          if (!bVar1) {
            return false;
          }
          break;
        case cmListFileLexer_Token_CommentBracket:
          aVar7 = SeparationError;
          break;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in cmake code at\n",0x17);
          poVar4 = std::operator<<((ostream *)local_1a8,this->FileName);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
          cmListFileLexer_GetCurrentLine(this->Lexer);
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"Parse error.  Function missing ending \")\".  ",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Instead found ",0xe);
          pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
          poVar4 = std::operator<<(poVar4,pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," with text \"",0xc);
          poVar4 = std::operator<<(poVar4,pcVar2->text);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error((char *)local_1d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_003ba771;
        }
        this->Separation = aVar7;
LAB_003ba333:
        cmListFileLexer_GetCurrentLine(this->Lexer);
        pcVar2 = cmListFileLexer_Scan(this->Lexer);
      } while (pcVar2 != (cmListFileLexer_Token *)0x0);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error in cmake code at\n",0x17);
    pcVar5 = this->FileName;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Parse error.  Function missing ending \")\".  ",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"End of file reached.",0x14);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)local_1d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error in cmake code at\n",0x17);
    pcVar5 = this->FileName;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    cmListFileLexer_GetCurrentLine(this->Lexer);
    poVar4 = std::ostream::_M_insert<long>((long)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Parse error.  Expected \"(\", got ",0x20);
    pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," with text \"",0xc);
    pcVar5 = pcVar2->text;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)local_1d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
  }
LAB_003ba771:
  if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,
                    (ulong)((long)&(((string *)local_1d8._16_8_)->_M_dataplus)._M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Inintialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while((token = cmListFileLexer_Scan(this->Lexer)) &&
        token->type == cmListFileLexer_Token_Space) {}
  if(!token)
    {
    std::ostringstream error;
    error << "Error in cmake code at\n" << this->FileName << ":"
          << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
          << "Parse error.  Function missing opening \"(\".";
    cmSystemTools::Error(error.str().c_str());
    return false;
    }
  if(token->type != cmListFileLexer_Token_ParenLeft)
    {
    std::ostringstream error;
    error << "Error in cmake code at\n" << this->FileName << ":"
          << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
          << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    cmSystemTools::Error(error.str().c_str());
    return false;
    }

  // Arguments.
  unsigned long lastLine;
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while((lastLine = cmListFileLexer_GetCurrentLine(this->Lexer),
         token = cmListFileLexer_Scan(this->Lexer)))
    {
    if(token->type == cmListFileLexer_Token_Space ||
       token->type == cmListFileLexer_Token_Newline)
      {
      this->Separation = SeparationOkay;
      continue;
      }
    if(token->type == cmListFileLexer_Token_ParenLeft)
      {
      parenDepth++;
      this->Separation = SeparationOkay;
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      }
    else if(token->type == cmListFileLexer_Token_ParenRight)
      {
      if (parenDepth == 0)
        {
        return true;
        }
      parenDepth--;
      this->Separation = SeparationOkay;
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_Identifier ||
            token->type == cmListFileLexer_Token_ArgumentUnquoted)
      {
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_ArgumentQuoted)
      {
      if(!this->AddArgument(token, cmListFileArgument::Quoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_ArgumentBracket)
      {
      if(!this->AddArgument(token, cmListFileArgument::Bracket))
        {
        return false;
        }
      this->Separation = SeparationError;
      }
    else if(token->type == cmListFileLexer_Token_CommentBracket)
      {
      this->Separation = SeparationError;
      }
    else
      {
      // Error.
      std::ostringstream error;
      error << "Error in cmake code at\n" << this->FileName << ":"
            << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
            << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      cmSystemTools::Error(error.str().c_str());
      return false;
      }
    }

  std::ostringstream error;
  error << "Error in cmake code at\n"
        << this->FileName << ":" << lastLine << ":\n"
        << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  cmSystemTools::Error(error.str().c_str());

  return false;
}